

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

char * columnTypeImpl(NameContext *pNC,Expr *pExpr,char **pzOrigDb,char **pzOrigTab,char **pzOrigCol
                     )

{
  SrcList *pSVar1;
  Db *pDVar2;
  Schema *pSVar3;
  uint uVar4;
  char *pcVar5;
  char *pcVar6;
  Expr *pExpr_00;
  long lVar7;
  long lVar8;
  Schema **ppSVar9;
  undefined8 *puVar10;
  long in_FS_OFFSET;
  NameContext sNC;
  char *zOrigTab;
  char *zOrigDb;
  undefined1 local_88 [40];
  undefined1 *puStack_60;
  Select *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pcVar5 = (char *)0x0;
  local_40 = (char *)0x0;
  local_48 = (char *)0x0;
  local_50 = (char *)0x0;
  if (pExpr->op == 0x8b) {
    local_88._8_8_ = ((pExpr->x).pSelect)->pSrc;
    pExpr_00 = ((pExpr->x).pSelect)->pEList->a[0].pExpr;
LAB_00186629:
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_88._32_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_88._16_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_58 = (Select *)&DAT_aaaaaaaaaaaaaaaa;
    local_88._0_8_ = pNC->pParse;
    local_88._24_8_ = pNC;
    pcVar5 = columnTypeImpl((NameContext *)local_88,pExpr_00,&local_40,&local_48,&local_50);
  }
  else {
    if (pExpr->op != 0xa8) goto LAB_0018669e;
    if (pNC != (NameContext *)0x0) {
      uVar4 = (uint)pExpr->iColumn;
      lVar7 = 0;
      do {
        pSVar1 = pNC->pSrcList;
        if (0 < (long)pSVar1->nSrc) {
          lVar8 = 0;
          do {
            if (*(int *)((long)&pSVar1->a[0].iCursor + lVar8) == pExpr->iTable) {
              puVar10 = *(undefined8 **)((long)&pSVar1->a[0].pSTab + lVar8);
              if (((&pSVar1->a[0].fg.field_0x1)[lVar8] & 4) == 0) {
                lVar7 = 0;
              }
              else {
                lVar7 = **(long **)((long)&pSVar1->a[0].u4 + lVar8);
              }
              goto LAB_001865cf;
            }
            lVar8 = lVar8 + 0x48;
          } while ((long)pSVar1->nSrc * 0x48 != lVar8);
        }
        pNC = pNC->pNext;
        puVar10 = (undefined8 *)0x0;
LAB_001865cf:
      } while ((pNC != (NameContext *)0x0) && (puVar10 == (undefined8 *)0x0));
      if (puVar10 != (undefined8 *)0x0) {
        if (lVar7 == 0) {
          if (pExpr->iColumn < 0) {
            uVar4 = (uint)*(short *)((long)puVar10 + 0x34);
          }
          if ((int)uVar4 < 0) {
            pcVar5 = "INTEGER";
            pcVar6 = "rowid";
          }
          else {
            pcVar6 = *(char **)(puVar10[1] + (ulong)uVar4 * 0x10);
            pcVar5 = sqlite3ColumnType((Column *)(puVar10[1] + (ulong)uVar4 * 0x10),(char *)0x0);
          }
          local_48 = (char *)*puVar10;
          local_50 = pcVar6;
          if ((pNC->pParse != (Parse *)0x0) && ((Schema *)puVar10[0xc] != (Schema *)0x0)) {
            pDVar2 = pNC->pParse->db->aDb;
            lVar7 = -0x100000000;
            ppSVar9 = &pDVar2->pSchema;
            do {
              lVar7 = lVar7 + 0x100000000;
              pSVar3 = *ppSVar9;
              ppSVar9 = ppSVar9 + 4;
            } while (pSVar3 != (Schema *)puVar10[0xc]);
            local_40 = *(char **)((long)&pDVar2->zDbSName + (lVar7 >> 0x1b));
          }
          goto LAB_0018669e;
        }
        if ((int)uVar4 < **(int **)(lVar7 + 0x20)) {
          local_88._8_8_ = *(undefined8 *)(lVar7 + 0x28);
          pExpr_00 = *(Expr **)(*(long *)(lVar7 + 0x20) + 8 + (long)(int)uVar4 * 0x18);
          goto LAB_00186629;
        }
      }
    }
    pcVar5 = (char *)0x0;
  }
LAB_0018669e:
  if (pzOrigDb != (char **)0x0) {
    *pzOrigDb = local_40;
    *pzOrigTab = local_48;
    *pzOrigCol = local_50;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return pcVar5;
}

Assistant:

static const char *columnTypeImpl(
  NameContext *pNC,
#ifndef SQLITE_ENABLE_COLUMN_METADATA
  Expr *pExpr
#else
  Expr *pExpr,
  const char **pzOrigDb,
  const char **pzOrigTab,
  const char **pzOrigCol
#endif
){
  char const *zType = 0;
  int j;
#ifdef SQLITE_ENABLE_COLUMN_METADATA
  char const *zOrigDb = 0;
  char const *zOrigTab = 0;
  char const *zOrigCol = 0;
#endif

  assert( pExpr!=0 );
  assert( pNC->pSrcList!=0 );
  switch( pExpr->op ){
    case TK_COLUMN: {
      /* The expression is a column. Locate the table the column is being
      ** extracted from in NameContext.pSrcList. This table may be real
      ** database table or a subquery.
      */
      Table *pTab = 0;            /* Table structure column is extracted from */
      Select *pS = 0;             /* Select the column is extracted from */
      int iCol = pExpr->iColumn;  /* Index of column in pTab */
      while( pNC && !pTab ){
        SrcList *pTabList = pNC->pSrcList;
        for(j=0;j<pTabList->nSrc && pTabList->a[j].iCursor!=pExpr->iTable;j++);
        if( j<pTabList->nSrc ){
          pTab = pTabList->a[j].pSTab;
          if( pTabList->a[j].fg.isSubquery ){
            pS = pTabList->a[j].u4.pSubq->pSelect;
          }else{
            pS = 0;
          }
        }else{
          pNC = pNC->pNext;
        }
      }

      if( pTab==0 ){
        /* At one time, code such as "SELECT new.x" within a trigger would
        ** cause this condition to run.  Since then, we have restructured how
        ** trigger code is generated and so this condition is no longer
        ** possible. However, it can still be true for statements like
        ** the following:
        **
        **   CREATE TABLE t1(col INTEGER);
        **   SELECT (SELECT t1.col) FROM FROM t1;
        **
        ** when columnType() is called on the expression "t1.col" in the
        ** sub-select. In this case, set the column type to NULL, even
        ** though it should really be "INTEGER".
        **
        ** This is not a problem, as the column type of "t1.col" is never
        ** used. When columnType() is called on the expression
        ** "(SELECT t1.col)", the correct type is returned (see the TK_SELECT
        ** branch below.  */
        break;
      }

      assert( pTab && ExprUseYTab(pExpr) && pExpr->y.pTab==pTab );
      if( pS ){
        /* The "table" is actually a sub-select or a view in the FROM clause
        ** of the SELECT statement. Return the declaration type and origin
        ** data for the result-set column of the sub-select.
        */
        if( iCol<pS->pEList->nExpr
         && (!ViewCanHaveRowid || iCol>=0)
        ){
          /* If iCol is less than zero, then the expression requests the
          ** rowid of the sub-select or view. This expression is legal (see
          ** test case misc2.2.2) - it always evaluates to NULL.
          */
          NameContext sNC;
          Expr *p = pS->pEList->a[iCol].pExpr;
          sNC.pSrcList = pS->pSrc;
          sNC.pNext = pNC;
          sNC.pParse = pNC->pParse;
          zType = columnType(&sNC, p,&zOrigDb,&zOrigTab,&zOrigCol);
        }
      }else{
        /* A real table or a CTE table */
        assert( !pS );
#ifdef SQLITE_ENABLE_COLUMN_METADATA
        if( iCol<0 ) iCol = pTab->iPKey;
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
          zOrigCol = "rowid";
        }else{
          zOrigCol = pTab->aCol[iCol].zCnName;
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
        zOrigTab = pTab->zName;
        if( pNC->pParse && pTab->pSchema ){
          int iDb = sqlite3SchemaToIndex(pNC->pParse->db, pTab->pSchema);
          zOrigDb = pNC->pParse->db->aDb[iDb].zDbSName;
        }
#else
        assert( iCol==XN_ROWID || (iCol>=0 && iCol<pTab->nCol) );
        if( iCol<0 ){
          zType = "INTEGER";
        }else{
          zType = sqlite3ColumnType(&pTab->aCol[iCol],0);
        }
#endif
      }
      break;
    }
#ifndef SQLITE_OMIT_SUBQUERY
    case TK_SELECT: {
      /* The expression is a sub-select. Return the declaration type and
      ** origin info for the single column in the result set of the SELECT
      ** statement.
      */
      NameContext sNC;
      Select *pS;
      Expr *p;
      assert( ExprUseXSelect(pExpr) );
      pS = pExpr->x.pSelect;
      p = pS->pEList->a[0].pExpr;
      sNC.pSrcList = pS->pSrc;
      sNC.pNext = pNC;
      sNC.pParse = pNC->pParse;
      zType = columnType(&sNC, p, &zOrigDb, &zOrigTab, &zOrigCol);
      break;
    }
#endif
  }

#ifdef SQLITE_ENABLE_COLUMN_METADATA
  if( pzOrigDb ){
    assert( pzOrigTab && pzOrigCol );
    *pzOrigDb = zOrigDb;
    *pzOrigTab = zOrigTab;
    *pzOrigCol = zOrigCol;
  }
#endif
  return zType;
}